

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

_variable_type gl4cts::Utils::getTransposedMatrixVariableType(_variable_type type)

{
  TestError *this;
  _variable_type local_10;
  _variable_type result;
  _variable_type type_local;
  
  switch(type) {
  case VARIABLE_TYPE_DMAT2:
    local_10 = VARIABLE_TYPE_DMAT2;
    break;
  case VARIABLE_TYPE_DMAT2X3:
    local_10 = VARIABLE_TYPE_DMAT3X2;
    break;
  case VARIABLE_TYPE_DMAT2X4:
    local_10 = VARIABLE_TYPE_DMAT4X2;
    break;
  case VARIABLE_TYPE_DMAT3:
    local_10 = VARIABLE_TYPE_DMAT3;
    break;
  case VARIABLE_TYPE_DMAT3X2:
    local_10 = VARIABLE_TYPE_DMAT2X3;
    break;
  case VARIABLE_TYPE_DMAT3X4:
    local_10 = VARIABLE_TYPE_DMAT4X3;
    break;
  case VARIABLE_TYPE_DMAT4:
    local_10 = VARIABLE_TYPE_DMAT4;
    break;
  case VARIABLE_TYPE_DMAT4X2:
    local_10 = VARIABLE_TYPE_DMAT2X4;
    break;
  case VARIABLE_TYPE_DMAT4X3:
    local_10 = VARIABLE_TYPE_DMAT3X4;
    break;
  default:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unrecognized double-precision matrix variable type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x50f);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_10;
}

Assistant:

Utils::_variable_type Utils::getTransposedMatrixVariableType(Utils::_variable_type type)
{
	Utils::_variable_type result;

	switch (type)
	{
	case VARIABLE_TYPE_DMAT2:
		result = VARIABLE_TYPE_DMAT2;
		break;
	case VARIABLE_TYPE_DMAT2X3:
		result = VARIABLE_TYPE_DMAT3X2;
		break;
	case VARIABLE_TYPE_DMAT2X4:
		result = VARIABLE_TYPE_DMAT4X2;
		break;
	case VARIABLE_TYPE_DMAT3:
		result = VARIABLE_TYPE_DMAT3;
		break;
	case VARIABLE_TYPE_DMAT3X2:
		result = VARIABLE_TYPE_DMAT2X3;
		break;
	case VARIABLE_TYPE_DMAT3X4:
		result = VARIABLE_TYPE_DMAT4X3;
		break;
	case VARIABLE_TYPE_DMAT4:
		result = VARIABLE_TYPE_DMAT4;
		break;
	case VARIABLE_TYPE_DMAT4X2:
		result = VARIABLE_TYPE_DMAT2X4;
		break;
	case VARIABLE_TYPE_DMAT4X3:
		result = VARIABLE_TYPE_DMAT3X4;
		break;

	default:
	{
		TCU_FAIL("Unrecognized double-precision matrix variable type.");
	}
	} /* switch (type) */

	return result;
}